

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::WriteReboot(FpgaIO *this)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  ostream *this_00;
  byte local_29;
  uint32_t write_data;
  FpgaIO *this_local;
  
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if (uVar2 < 7) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "FpgaIO::WriteReboot: requires firmware 7 or above");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    if ((this->super_BoardIO).port == (BasePort *)0x0) {
      local_29 = 0;
    }
    else {
      pBVar1 = (this->super_BoardIO).port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,0,0x300000);
      local_29 = (byte)iVar3;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::WriteReboot(void)
{
    if (GetFirmwareVersion() < 7) {
        // Could instead allow this to be used with older firmware, where the "reboot"
        // flag was instead used as a "soft reset".
        std::cerr << "FpgaIO::WriteReboot: requires firmware 7 or above" << std::endl;
        return false;
    }
    uint32_t write_data = REBOOT_FPGA;
    return (port ? port->WriteQuadlet(BoardId, BoardIO::BOARD_STATUS, write_data) : false);
}